

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O1

void NextChunk(ListChunkTraverseInfo *info,size_t nb,int reverse)

{
  size_t *psVar1;
  Col_Word list;
  long lVar2;
  size_t sVar3;
  
  psVar1 = &info->max;
  *psVar1 = *psVar1 - nb;
  if (*psVar1 == 0) {
    lVar2 = (long)info->prevDepth;
    if (lVar2 == 0x7fffffff) {
      info->list = 0;
    }
    else {
      list = info->backtracks[lVar2 + -1].list;
      info->list = list;
      info->max = info->backtracks[lVar2 + -1].max;
      if (reverse == 0) {
        sVar3 = 0;
      }
      else {
        sVar3 = Col_ListLength(list);
        sVar3 = sVar3 - 1;
      }
      info->start = sVar3;
      info->prevDepth = info->backtracks[(long)info->prevDepth + -1].prevDepth;
    }
  }
  else {
    if (reverse == 0) {
      sVar3 = info->start + nb;
    }
    else {
      sVar3 = info->start - nb;
    }
    info->start = sVar3;
  }
  return;
}

Assistant:

static void
NextChunk(
    RopeChunkTraverseInfo *info,    /*!< Traversal info. */
    size_t nb,                      /*!< Number of characters to skip. */
    int reverse)                    /*!< Whether to traverse in reverse order.*/
{
    ASSERT(info->max >= nb);
    info->max -= nb;
    if (info->max > 0) {
        /*
         * Still in leaf, advance.
         */

        if (reverse) {
            info->start -= nb;
        } else {
            info->start += nb;
        }
    } else if (info->prevDepth == INT_MAX) {
        /*
         * Already at toplevel => end of rope.
         */

        info->rope = WORD_NIL;
    } else {
        /*
         * Reached leaf bound, backtracks.
         */

        ASSERT(info->backtracks);
        info->rope = info->backtracks[info->prevDepth-1].rope;
        info->max = info->backtracks[info->prevDepth-1].max;
        info->start = (reverse ? Col_RopeLength(info->rope)-1 : 0);
        info->prevDepth = info->backtracks[info->prevDepth-1].prevDepth;
    }
}